

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format * __thiscall
format::string<std::__cxx11::string,char_const[8],unsigned_long_long,unsigned_long_long>
          (format *this,char (*fmt) [8],unsigned_long_long *args,unsigned_long_long *args_1)

{
  unsigned_long_long *args_local_1;
  unsigned_long_long *args_local;
  char (*fmt_local) [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  
  std::__cxx11::string::string((string *)this);
  append_string<std::__cxx11::string,char_const[8],unsigned_long_long,unsigned_long_long>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,fmt,args,
             args_1);
  return this;
}

Assistant:

StringType string(FormatType& fmt,
                    Args&& ... args) {
    StringType output;
    append_string(output, fmt, std::forward<Args>(args)...);
    return output;
  }